

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

void __thiscall
GenericModelItem::sortChildren
          (GenericModelItem *this,int column,int role,SortOrder order,bool recursive,
          QModelIndexList *persistentIndexes,QVector<RolesContainer> *headersToSort)

{
  int iVar1;
  uint uVar2;
  QMap<int,_QVariant> *pQVar3;
  GenericModelItem *pGVar4;
  uint uVar5;
  iterator iVar6;
  iterator iVar7;
  long lVar8;
  reference pQVar9;
  qsizetype qVar10;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar11;
  int i;
  ulong uVar12;
  long lVar13;
  pair<GenericModelItem_**,_long> pVar14;
  QVector<GenericModelItem_*> columnChildren;
  QModelIndexList changedPersistentIndexesTo;
  QModelIndexList changedPersistentIndexesFrom;
  QVector<GenericModelItem_*> newChildren;
  QList<GenericModelItem_*> local_f8;
  QMovableArrayOps<QModelIndex> local_d8;
  QModelIndexList *local_c0;
  QArrayDataPointer<QMap<int,_QVariant>_> local_b8;
  QArrayDataPointer<QMap<int,_QVariant>_> local_98;
  QModelIndex local_80;
  QArrayDataPointer<QMap<int,_QVariant>_> local_68;
  QModelIndex local_48;
  
  lVar8 = (this->children).d.size;
  if (lVar8 == 0) {
    return;
  }
  if (this->m_colCount <= column) {
    return;
  }
  uVar5 = (uint)lVar8;
  if (recursive && 0 < (int)uVar5) {
    local_c0 = (QModelIndexList *)(ulong)(uVar5 & 0x7fffffff);
    uVar12 = 0;
    do {
      sortChildren((this->children).d.ptr[uVar12],column,role,order,true,persistentIndexes,
                   (QVector<RolesContainer> *)0x0);
      uVar12 = uVar12 + 1;
    } while (local_c0 != (QModelIndexList *)uVar12);
  }
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (GenericModelItem **)0x0;
  local_f8.d.size = 0;
  local_c0 = persistentIndexes;
  QList<GenericModelItem_*>::reserve(&local_f8,(long)this->m_rowCount);
  iVar1 = (int)(this->children).d.size;
  if (column < iVar1) {
    do {
      local_98.d = (Data *)(this->children).d.ptr[column];
      QtPrivate::QPodArrayOps<GenericModelItem*>::emplace<GenericModelItem*&>
                ((QPodArrayOps<GenericModelItem*> *)&local_f8,local_f8.d.size,
                 (GenericModelItem **)&local_98);
      column = column + this->m_colCount;
    } while (column < iVar1);
  }
  if (order == AscendingOrder) {
    iVar6 = QList<GenericModelItem_*>::begin(&local_f8);
    iVar7 = QList<GenericModelItem_*>::end(&local_f8);
    if (iVar6.i == iVar7.i) goto LAB_0012d0ba;
    lVar8 = (long)iVar7.i - (long)iVar6.i >> 3;
    pVar14 = std::get_temporary_buffer<GenericModelItem*>((lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
    if (pVar14.first == (GenericModelItem **)0x0) {
      pVar14 = (pair<GenericModelItem_**,_long>)ZEXT816(0);
      std::
      __inplace_stable_sort<QList<GenericModelItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__0>>
                (iVar6,iVar7,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_VSRonin[P]QtModelUtilities_src_genericmodel_cpp:434:33)>
                  )role);
    }
    else {
      std::
      __stable_sort_adaptive<QList<GenericModelItem*>::iterator,GenericModelItem**,long_long,__gnu_cxx::__ops::_Iter_comp_iter<GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__0>>
                (iVar6,iVar7,pVar14.first,pVar14.second,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_VSRonin[P]QtModelUtilities_src_genericmodel_cpp:434:33)>
                  )role);
    }
  }
  else {
    iVar6 = QList<GenericModelItem_*>::begin(&local_f8);
    iVar7 = QList<GenericModelItem_*>::end(&local_f8);
    if (iVar6.i == iVar7.i) goto LAB_0012d0ba;
    lVar8 = (long)iVar7.i - (long)iVar6.i >> 3;
    pVar14 = std::get_temporary_buffer<GenericModelItem*>((lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
    if (pVar14.first == (GenericModelItem **)0x0) {
      pVar14 = (pair<GenericModelItem_**,_long>)ZEXT816(0);
      std::
      __inplace_stable_sort<QList<GenericModelItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__1>>
                (iVar6,iVar7,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_VSRonin[P]QtModelUtilities_src_genericmodel_cpp:437:36)>
                  )role);
    }
    else {
      std::
      __stable_sort_adaptive<QList<GenericModelItem*>::iterator,GenericModelItem**,long_long,__gnu_cxx::__ops::_Iter_comp_iter<GenericModelItem::sortChildren(int,int,Qt::SortOrder,bool,QList<QModelIndex>const&,QList<QMap<int,QVariant>>*)::__1>>
                (iVar6,iVar7,pVar14.first,pVar14.second,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_VSRonin[P]QtModelUtilities_src_genericmodel_cpp:437:36)>
                  )role);
    }
  }
  operator_delete(pVar14.first,pVar14.second << 3);
LAB_0012d0ba:
  local_68.d = (Data *)0x0;
  local_68.ptr = (QMap<int,_QVariant> *)0x0;
  local_68.size = 0;
  if (headersToSort != (QVector<RolesContainer> *)0x0) {
    local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.d =
         (Data *)0x0;
    QList<QMap<int,_QVariant>_>::QList
              ((QList<QMap<int,_QVariant>_> *)&local_b8,(headersToSort->d).size,
               (parameter_type)&local_d8);
    local_98.size = local_68.size;
    local_98.ptr = local_68.ptr;
    local_98.d = local_68.d;
    local_68.size = local_b8.size;
    local_68.ptr = local_b8.ptr;
    local_68.d = local_b8.d;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QMap<int,_QVariant> *)0x0;
    local_b8.size = 0;
    QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_b8);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                *)&local_d8);
  }
  local_98.d = (Data *)0x0;
  local_98.ptr = (QMap<int,_QVariant> *)0x0;
  local_98.size = 0;
  QList<GenericModelItem_*>::reserve((QList<GenericModelItem_*> *)&local_98,(this->children).d.size)
  ;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QMap<int,_QVariant> *)0x0;
  local_b8.size = 0;
  local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.size = 0;
  local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.d = (Data *)0x0;
  local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.ptr =
       (QModelIndex *)0x0;
  uVar5 = (uint)local_f8.d.size;
  if (0 < (int)uVar5) {
    uVar12 = 0;
    do {
      uVar2 = local_f8.d.ptr[uVar12]->m_row;
      lVar8 = (long)(int)uVar2;
      if (headersToSort != (QVector<RolesContainer> *)0x0) {
        pQVar3 = (headersToSort->d).ptr;
        pQVar9 = QList<QMap<int,_QVariant>_>::operator[]
                           ((QList<QMap<int,_QVariant>_> *)&local_68,uVar12);
        pQVar11 = pQVar3[lVar8].d.d;
        if (pQVar11 ==
            (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
             *)0x0) {
          pQVar11 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0;
        }
        else {
          LOCK();
          (pQVar11->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)
                (pQVar11->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
          UNLOCK();
        }
        local_80._0_8_ = (pQVar9->d).d;
        (pQVar9->d).d = pQVar11;
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2
                  ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    *)&local_80);
      }
      lVar13 = this->m_colCount * lVar8;
      if ((int)lVar13 < (int)(lVar8 + 1) * this->m_colCount) {
        do {
          pGVar4 = (this->children).d.ptr[lVar13];
          if (uVar12 != uVar2) {
            local_80.m = &this->m_model->super_QAbstractItemModel;
            local_80._0_8_ = *(undefined8 *)&pGVar4->m_row;
            local_80.i = (quintptr)pGVar4;
            qVar10 = QtPrivate::indexOf<QModelIndex,QModelIndex>(local_c0,&local_80,0);
            if (qVar10 != -1) {
              QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                        ((QMovableArrayOps<QModelIndex> *)&local_b8,local_b8.size,&local_80);
              local_48.m = &this->m_model->super_QAbstractItemModel;
              local_48.c = pGVar4->m_column;
              local_48.r = (int)uVar12;
              local_48.i = (quintptr)pGVar4;
              QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                        (&local_d8,
                         local_d8.super_QGenericArrayOps<QModelIndex>.
                         super_QArrayDataPointer<QModelIndex>.size,&local_48);
            }
            pGVar4->m_row = (int)uVar12;
          }
          local_80._0_8_ = pGVar4;
          QtPrivate::QPodArrayOps<GenericModelItem*>::emplace<GenericModelItem*&>
                    ((QPodArrayOps<GenericModelItem*> *)&local_98,local_98.size,
                     (GenericModelItem **)&local_80);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (long)this->m_colCount * (lVar8 + 1));
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uVar5 & 0x7fffffff));
  }
  QArrayDataPointer<GenericModelItem_*>::operator=
            (&(this->children).d,(QArrayDataPointer<GenericModelItem_*> *)&local_98);
  if (headersToSort != (QVector<RolesContainer> *)0x0) {
    QArrayDataPointer<QMap<int,_QVariant>_>::operator=(&headersToSort->d,&local_68);
  }
  QAbstractItemModel::changePersistentIndexList((QList *)this->m_model,(QList *)&local_b8);
  if (&(local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.d)->
       super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.d)->
    super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.d)->
         super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>.d)->
        super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&(local_d8.super_QGenericArrayOps<QModelIndex>.super_QArrayDataPointer<QModelIndex>
                  .d)->super_QArrayData,0x18,8);
    }
  }
  if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d)->super_QArrayData,0x18,8);
    }
  }
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,8);
    }
  }
  QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_68);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,8,8);
    }
  }
  return;
}

Assistant:

void GenericModelItem::sortChildren(int column, int role, Qt::SortOrder order, bool recursive, const QModelIndexList &persistentIndexes,
                                    QVector<RolesContainer> *headersToSort)
{
    Q_ASSERT(column >= 0);
    if (children.isEmpty() || column >= m_colCount)
        return;
    if (recursive) {
        for (int i = 0, maxI = children.size(); i < maxI; ++i)
            children.at(i)->sortChildren(column, role, order, recursive, persistentIndexes, nullptr);
    }
    QVector<GenericModelItem *> columnChildren;
    columnChildren.reserve(m_rowCount);
    for (int i = column, maxI = children.size(); i < maxI; i += m_colCount) {
        GenericModelItem *columnChild = children.at(i);
        columnChildren.append(columnChild);
    }
    const auto lessComparison = [role](const GenericModelItem *a, const GenericModelItem *b) -> bool {
        return GenericModelPrivate::isVariantLessThan(a->data.value(role), b->data.value(role));
    };
    const auto greaterComparison = [role](const GenericModelItem *a, const GenericModelItem *b) -> bool {
        return GenericModelPrivate::isVariantLessThan(b->data.value(role), a->data.value(role));
    };
    if (order == Qt::AscendingOrder)
        std::stable_sort(columnChildren.begin(), columnChildren.end(), lessComparison);
    else
        std::stable_sort(columnChildren.begin(), columnChildren.end(), greaterComparison);
    QVector<RolesContainer> updatedHeadersToSort;
    if (headersToSort)
        updatedHeadersToSort = QVector<RolesContainer>(headersToSort->size(), RolesContainer());
    QVector<GenericModelItem *> newChildren;
    newChildren.reserve(children.size());
    QModelIndexList changedPersistentIndexesFrom, changedPersistentIndexesTo;
    for (int toRow = 0, maxRow = columnChildren.size(); toRow < maxRow; ++toRow) {
        GenericModelItem *const columnChild = columnChildren.at(toRow);
        const int fromRow = columnChild->m_row;
        if (headersToSort)
            updatedHeadersToSort[toRow] = headersToSort->at(fromRow);
        for (int i = m_colCount * fromRow; i < m_colCount * (fromRow + 1); ++i) {
            GenericModelItem *const iChild = children.at(i);
            if (toRow != fromRow) {
                QModelIndex fromIdx = m_model->createIndex(iChild->m_row, iChild->m_column, iChild);
                if (persistentIndexes.contains(fromIdx)) {
                    changedPersistentIndexesFrom.append(fromIdx);
                    changedPersistentIndexesTo.append(m_model->createIndex(toRow, iChild->m_column, iChild));
                }
                iChild->m_row = toRow;
            }
            newChildren.append(iChild);
        }
    }
    Q_ASSERT(newChildren.size() == children.size());
    Q_ASSERT(std::all_of(newChildren.constBegin(), newChildren.constEnd(), [](const GenericModelItem *a) -> bool { return a != nullptr; }));
    children = newChildren;
    if (headersToSort)
        *headersToSort = updatedHeadersToSort;
    m_model->changePersistentIndexList(changedPersistentIndexesFrom, changedPersistentIndexesTo);
}